

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O3

UChar * __thiscall
icu_63::Normalizer2Impl::findPreviousFCDBoundary(Normalizer2Impl *this,UChar *start,UChar *p)

{
  UChar UVar1;
  uint16_t norm16;
  UBool UVar2;
  int iVar3;
  UCPTrie *trie;
  uint c;
  UChar *pUVar4;
  
  do {
    if (p <= start) {
      return p;
    }
    pUVar4 = p + -1;
    UVar1 = p[-1];
    c = (uint)(ushort)UVar1;
    if ((c & 0xf800) == 0xd800) {
      if ((pUVar4 != start & (byte)((ushort)UVar1 >> 10) & 1) == 0) {
        trie = this->normTrie;
      }
      else {
        trie = this->normTrie;
        if ((p[-2] & 0xfc00U) == 0xd800) {
          pUVar4 = p + -2;
          c = c + (uint)(ushort)p[-2] * 0x400 + 0xfca02400;
          if ((int)c < trie->highStart) {
            iVar3 = ucptrie_internalSmallIndex_63(trie,c);
            trie = this->normTrie;
          }
          else {
            iVar3 = trie->dataLength + -2;
          }
          goto LAB_00299adf;
        }
      }
      iVar3 = trie->dataLength + -1;
    }
    else {
      trie = this->normTrie;
      iVar3 = (c & 0x3f) + (uint)trie->index[(ushort)UVar1 >> 6];
    }
LAB_00299adf:
    if (c < (ushort)this->minDecompNoCP) {
      return p;
    }
    norm16 = *(uint16_t *)((long)(trie->data).ptr0 + (long)iVar3 * 2);
    UVar2 = norm16HasDecompBoundaryAfter(this,norm16);
    if (UVar2 != '\0') {
      return p;
    }
    UVar2 = norm16HasDecompBoundaryBefore(this,norm16);
    p = pUVar4;
    if (UVar2 != '\0') {
      return pUVar4;
    }
  } while( true );
}

Assistant:

const UChar *Normalizer2Impl::findPreviousFCDBoundary(const UChar *start, const UChar *p) const {
    while(start<p) {
        const UChar *codePointLimit = p;
        UChar32 c;
        uint16_t norm16;
        UCPTRIE_FAST_U16_PREV(normTrie, UCPTRIE_16, start, p, c, norm16);
        if (c < minDecompNoCP || norm16HasDecompBoundaryAfter(norm16)) {
            return codePointLimit;
        }
        if (norm16HasDecompBoundaryBefore(norm16)) {
            return p;
        }
    }
    return p;
}